

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O2

double getdistortion(jas_matrix_t *orig,jas_matrix_t *recon,int depth,int metric)

{
  double dVar1;
  int iStack_10;
  
  switch(metric) {
  case 1:
    dVar1 = pae(orig,recon);
    dVar1 = (double)(-(ulong)(dVar1 != 0.0) & 0x3ff0000000000000);
    break;
  default:
    dVar1 = psnr(orig,recon,depth);
    return dVar1;
  case 3:
    iStack_10 = 2;
    goto LAB_00102b1d;
  case 4:
    dVar1 = msen(orig,recon,2);
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
      return dVar1;
    }
    dVar1 = SQRT(dVar1);
    break;
  case 5:
    dVar1 = pae(orig,recon);
    return dVar1;
  case 6:
    iStack_10 = 1;
LAB_00102b1d:
    dVar1 = msen(orig,recon,iStack_10);
    return dVar1;
  }
  return dVar1;
}

Assistant:

double getdistortion(jas_matrix_t *orig, jas_matrix_t *recon, int depth, int metric)
{
	double d;

	switch (metric) {
	case metricid_psnr:
	default:
		d = psnr(orig, recon, depth);
		break;
	case metricid_mae:
		d = msen(orig, recon, 1);
		break;
	case metricid_mse:
		d = msen(orig, recon, 2);
		break;
	case metricid_rmse:
		d = sqrt(msen(orig, recon, 2));
		break;
	case metricid_pae:
		d = pae(orig, recon);
		break;
	case metricid_equal:
		d = (pae(orig, recon) == 0) ? 0 : 1;
		break;
	}
	return d;
}